

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_dup_common(lyd_node *parent,lyd_node *new,lyd_node *orig,ly_ctx *ctx)

{
  char *pcVar1;
  int iVar2;
  lys_module *plVar3;
  size_t sVar4;
  LY_ERR *pLVar5;
  lys_node *plVar6;
  ly_ctx *local_70;
  lys_module *trg_mod;
  lyd_attr *attr;
  ly_ctx *ctx_local;
  lyd_node *orig_local;
  lyd_node *new_local;
  lyd_node *parent_local;
  
  if (ctx == (ly_ctx *)0x0) {
    new->schema = orig->schema;
  }
  else {
    if (parent == (lyd_node *)0x0) {
      plVar6 = lyd_get_schema_inctx(orig,ctx);
      new->schema = plVar6;
    }
    else {
      plVar3 = lys_node_module(parent->schema);
      pcVar1 = orig->schema->module->name;
      sVar4 = strlen(orig->schema->module->name);
      plVar3 = lys_get_import_module(plVar3,(char *)0x0,0,pcVar1,(int)sVar4);
      if (plVar3 == (lys_module *)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
               ,0x1178);
        return 1;
      }
      plVar6 = parent->schema->child;
      pcVar1 = orig->schema->name;
      sVar4 = strlen(orig->schema->name);
      lys_get_data_sibling(plVar3,plVar6,pcVar1,(int)sVar4,orig->schema->nodetype,&new->schema);
    }
    if (new->schema == (lys_node *)0x0) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINVAL;
      ly_log(LY_LLERR,
             "Target context does not contain schema node for the data node being duplicated (%s:%s)."
             ,orig->schema->module->name,orig->schema->name);
      return 1;
    }
  }
  new->attr = (lyd_attr *)0x0;
  for (trg_mod = (lys_module *)orig->attr; trg_mod != (lys_module *)0x0;
      trg_mod = (lys_module *)trg_mod->name) {
    local_70 = ctx;
    if (ctx == (ly_ctx *)0x0) {
      local_70 = orig->schema->module->ctx;
    }
    lyd_dup_attr(local_70,new,(lyd_attr *)trg_mod);
  }
  new->next = (lyd_node *)0x0;
  new->prev = new;
  new->parent = (lyd_node *)0x0;
  iVar2 = ly_new_node_validity(new->schema);
  new->validity = (uint8_t)iVar2;
  new->field_0x9 = new->field_0x9 & 0xfe | orig->field_0x9 & 1;
  new->field_0x9 = new->field_0x9 & 0xf1 | ((byte)orig->field_0x9 >> 1 & 4) << 1;
  if ((parent == (lyd_node *)0x0) || (iVar2 = lyd_insert(parent,new), iVar2 == 0)) {
    parent_local._4_4_ = 0;
  }
  else {
    parent_local._4_4_ = 1;
  }
  return parent_local._4_4_;
}

Assistant:

static int
lyd_dup_common(struct lyd_node *parent, struct lyd_node *new, const struct lyd_node *orig, struct ly_ctx *ctx)
{
    struct lyd_attr *attr;
    const struct lys_module *trg_mod;

    /* fill common part */
    if (ctx) {
        /* we are changing the context, so we have to get the correct schema node in the new context */
        if (parent) {
            trg_mod = lys_get_import_module(lys_node_module(parent->schema), NULL, 0, orig->schema->module->name,
                                            strlen(orig->schema->module->name));
            if (!trg_mod) {
                LOGINT;
                return EXIT_FAILURE;
            }
            /* we know its parent, so we can start with it */
            lys_get_data_sibling(trg_mod, parent->schema->child, orig->schema->name, strlen(orig->schema->name),
                                 orig->schema->nodetype, (const struct lys_node **)&new->schema);
        } else {
            /* we have to search in complete context */
            new->schema = lyd_get_schema_inctx(orig, ctx);
        }

        if (!new->schema) {
            LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being duplicated "
                   "(%s:%s).", orig->schema->module->name, orig->schema->name);
            return EXIT_FAILURE;
        }
    } else {
        /* the context is the same so also the pointer into the schema will be the same */
        new->schema = orig->schema;
    }
    new->attr = NULL;
    LY_TREE_FOR(orig->attr, attr) {
        lyd_dup_attr(ctx ? ctx : orig->schema->module->ctx, new, attr);
    }
    new->next = NULL;
    new->prev = new;
    new->parent = NULL;
    new->validity = ly_new_node_validity(new->schema);
    new->dflt = orig->dflt;
    new->when_status = orig->when_status & LYD_WHEN;

    if (parent && lyd_insert(parent, new)) {
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}